

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::PresetVectorIntHelper
               (vector<int,_std::allocator<int>_> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  _func_bool_int_ptr_Value_ptr_cmJSONState_ptr *in_RCX;
  function<void_(const_Json::Value_*,_cmJSONState_*)> local_40;
  cmJSONState *local_20;
  cmJSONState *state_local;
  Value *value_local;
  vector<int,_std::allocator<int>_> *out_local;
  
  local_20 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)::
      helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      std::function<void(Json::Value_const*,cmJSONState*)>::
      function<void(&)(Json::Value_const*,cmJSONState*),void>
                ((function<void(Json::Value_const*,cmJSONState*)> *)&local_40,
                 cmCMakePresetsErrors::INVALID_PRESET);
      cmJSONHelperBuilder::Vector<int,bool(*)(int&,Json::Value_const*,cmJSONState*)>
                (&PresetVectorIntHelper::helper,(cmJSONHelperBuilder *)&local_40,
                 (ErrorGenerator *)PresetIntHelper,in_RCX);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_40);
      __cxa_atexit(std::
                   function<bool_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                   ::~function,&PresetVectorIntHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<int,_std::allocator<int>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&PresetVectorIntHelper::helper,
                       (vector<int,_std::allocator<int>_> *)value_local,(Value *)state_local,
                       local_20);
  return bVar1;
}

Assistant:

bool PresetVectorIntHelper(std::vector<int>& out, const Json::Value* value,
                           cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<int>(
    cmCMakePresetsErrors::INVALID_PRESET, PresetIntHelper);
  return helper(out, value, state);
}